

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

InterCode * __thiscall
IrSim::icUnaryOp(InterCode *__return_storage_ptr__,IrSim *this,int kind,C_OP *t,C_OP *a1)

{
  undefined1 auStack_78 [48];
  undefined1 local_48 [48];
  
  Operand::Operand((Operand *)local_48,t);
  Operand::Operand((Operand *)auStack_78,a1);
  InterCode::InterCode(__return_storage_ptr__,kind,(Operand *)local_48,(Operand *)auStack_78);
  std::__cxx11::string::~string((string *)(auStack_78 + 8));
  std::__cxx11::string::~string((string *)(local_48 + 8));
  return __return_storage_ptr__;
}

Assistant:

InterCode icUnaryOp(int kind, C_OP &t, C_OP &a1) const { return InterCode(kind, t, a1); }